

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_demo.cpp
# Opt level: O1

void ImGui::ShowUserGuide(void)

{
  ImGuiIO *pIVar1;
  char *fmt;
  
  pIVar1 = GetIO();
  BulletText("Double-click on title bar to collapse window.");
  BulletText(
            "Click and drag on lower corner to resize window\n(double-click to auto fit window to its contents)."
            );
  fmt = "Click and drag on any empty space to move window.";
  if (pIVar1->ConfigWindowsMoveFromTitleBarOnly != false) {
    fmt = "Click and drag on title bar to move window.";
  }
  BulletText(fmt);
  BulletText("TAB/SHIFT+TAB to cycle through keyboard editable fields.");
  BulletText("CTRL+Click on a slider or drag box to input value as text.");
  if (pIVar1->FontAllowUserScaling == true) {
    BulletText("CTRL+Mouse Wheel to zoom window contents.");
  }
  BulletText("Mouse Wheel to scroll.");
  BulletText("While editing text:\n");
  Indent(0.0);
  BulletText("Hold SHIFT or use mouse to select text.");
  BulletText("CTRL+Left/Right to word jump.");
  BulletText("CTRL+A or double-click to select all.");
  BulletText("CTRL+X,CTRL+C,CTRL+V to use clipboard.");
  BulletText("CTRL+Z,CTRL+Y to undo/redo.");
  BulletText("ESCAPE to revert.");
  BulletText("You can apply arithmetic operators +,*,/ on numerical values.\nUse +- to subtract.");
  Unindent(0.0);
  return;
}

Assistant:

void ImGui::ShowUserGuide()
{
    ImGuiIO& io = ImGui::GetIO();
    ImGui::BulletText("Double-click on title bar to collapse window.");
    ImGui::BulletText("Click and drag on lower corner to resize window\n(double-click to auto fit window to its contents).");
    if (io.ConfigWindowsMoveFromTitleBarOnly)
        ImGui::BulletText("Click and drag on title bar to move window.");
    else
        ImGui::BulletText("Click and drag on any empty space to move window.");
    ImGui::BulletText("TAB/SHIFT+TAB to cycle through keyboard editable fields.");
    ImGui::BulletText("CTRL+Click on a slider or drag box to input value as text.");
    if (io.FontAllowUserScaling)
        ImGui::BulletText("CTRL+Mouse Wheel to zoom window contents.");
    ImGui::BulletText("Mouse Wheel to scroll.");
    ImGui::BulletText("While editing text:\n");
    ImGui::Indent();
    ImGui::BulletText("Hold SHIFT or use mouse to select text.");
    ImGui::BulletText("CTRL+Left/Right to word jump.");
    ImGui::BulletText("CTRL+A or double-click to select all.");
    ImGui::BulletText("CTRL+X,CTRL+C,CTRL+V to use clipboard.");
    ImGui::BulletText("CTRL+Z,CTRL+Y to undo/redo.");
    ImGui::BulletText("ESCAPE to revert.");
    ImGui::BulletText("You can apply arithmetic operators +,*,/ on numerical values.\nUse +- to subtract.");
    ImGui::Unindent();
}